

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O3

int dodown(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  obj **ppoVar3;
  boolean bVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  trap *ptVar8;
  obj *otmp;
  char *pcVar9;
  int n;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  int n_1;
  uint uVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  
  if ((u.ux != (level->dnstair).sx) || (bVar15 = true, u.uy != (level->dnstair).sy)) {
    if ((u.ux == (level->sstairs).sx) && (u.uy == (level->sstairs).sy)) {
      bVar15 = (level->sstairs).up == '\0';
    }
    else {
      bVar15 = false;
    }
  }
  if (u.ux == (level->dnladder).sx) {
    bVar16 = u.uy == (level->dnladder).sy;
  }
  else {
    bVar16 = false;
  }
  if (u.usteed != (monst *)0x0) {
    if (((u.usteed)->field_0x62 & 4) == 0) {
      pcVar7 = Monnam(u.usteed);
      pcVar9 = "%s won\'t move!";
      goto LAB_0016f26a;
    }
    if ((u.usteed)->meating != 0) {
      pcVar7 = Monnam(u.usteed);
      pcVar9 = "%s is still eating.";
      goto LAB_0016f26a;
    }
  }
  if (u.uprops[0x12].intrinsic != 0 || u.uprops[0x12].extrinsic != 0) {
    if ((u.uprops[0x12].extrinsic & 0x2000) != 0 || (u.uprops[0x12].intrinsic & 0x10000000) != 0) {
      otmp = invent;
      if (invent != (obj *)0x0 && (u.uprops[0x12].extrinsic >> 0xd & 1) != 0) {
        do {
          if ((otmp->oartifact != '\0') &&
             (bVar4 = artifact_has_invprop(otmp,'\x12'), uVar13 = moves, bVar4 != '\0')) {
            uVar10 = otmp->age;
            uVar6 = mt_random();
            uVar11 = (ulong)(uVar6 % 1000 + 1000);
            if (uVar10 < uVar13) {
              uVar10 = 1;
              do {
                uVar6 = mt_random();
                if (1 < uVar6 % 6) goto LAB_0016f359;
                uVar10 = uVar10 + 1;
              } while (uVar10 != 10);
              uVar10 = 10;
LAB_0016f359:
              uVar11 = uVar10 * uVar11;
              uVar10 = mt_random();
              if ((uVar10 & 1) == 0) {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = uVar11;
                iVar14 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(100000)) / auVar1,0);
              }
              else {
                iVar14 = (int)(uVar11 / 10);
              }
              iVar14 = uVar13 + iVar14;
            }
            else {
              uVar13 = 1;
              do {
                uVar10 = mt_random();
                if (1 < uVar10 % 6) goto LAB_0016f3a5;
                uVar13 = uVar13 + 1;
              } while (uVar13 != 10);
              uVar13 = 10;
LAB_0016f3a5:
              uVar11 = uVar13 * uVar11;
              uVar13 = mt_random();
              if ((uVar13 & 1) == 0) {
                auVar2._8_8_ = 0;
                auVar2._0_8_ = uVar11;
                iVar14 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(100000)) / auVar2,0);
              }
              else {
                iVar14 = (int)(uVar11 / 10);
              }
              iVar14 = iVar14 + otmp->age;
            }
            otmp->age = iVar14;
          }
          ppoVar3 = &otmp->nobj;
          otmp = *ppoVar3;
        } while (*ppoVar3 != (obj *)0x0);
      }
      iVar14 = float_down(0x10ffffff,0x2000);
      if (iVar14 != 0) {
        return 1;
      }
    }
LAB_0016f445:
    if (bVar15) {
      pcVar7 = "stairs";
    }
    else if (bVar16) {
      pcVar7 = "ladder";
    }
    else {
      pcVar7 = surface((int)u.ux,(int)u.uy);
    }
    floating_above(pcVar7);
    return 0;
  }
  if ((youmonst.data)->mlet == '\x05') goto LAB_0016f445;
  if (bVar15 || bVar16) {
    ptVar8 = (trap *)0x0;
  }
  else {
    ptVar8 = t_at(level,(int)u.ux,(int)u.uy);
    if ((((ptVar8 == (trap *)0x0) || (bVar12 = ptVar8->field_0x8 & 0x1f, 3 < (byte)(bVar12 - 0xb)))
        || ((bVar4 = can_fall_thru(level), bVar4 == '\0' && ((byte)(bVar12 - 0xd) < 2)))) ||
       ((ptVar8->field_0x8 & 0x20) == 0)) {
      if ((((uwep != (obj *)0x0 && flags.autodig != '\0') && flags.nopick == '\0') &&
          ((byte)(uwep->oclass | 4U) == 6)) && (objects[uwep->otyp].oc_subtyp == '\x04'))
      goto LAB_0016f538;
      pcVar7 = "You can\'t go down here.";
      goto LAB_0016f55b;
    }
  }
  if (u.ustuck == (monst *)0x0) {
    bVar4 = on_level(&dungeon_topology.d_valley_level,&u.uz);
    if ((bVar4 != '\0') && ((u.uevent._1_1_ & 4) == 0)) {
      pline("You are standing at the gate to Gehennom.");
      pline("Unspeakable cruelty and harm lurk down there.");
      cVar5 = yn_function("Are you sure you want to enter?","yn",'n');
      if (cVar5 != 'y') {
        return 0;
      }
      pline("So be it.");
      u.uevent._1_1_ = u.uevent._1_1_ | 4;
    }
    bVar4 = next_to_u();
    if (bVar4 == '\0') {
      pcVar7 = "You are held back by your pet!";
LAB_0016f55b:
      pline(pcVar7);
      return 0;
    }
    if (ptVar8 != (trap *)0x0) {
      if ((byte)((ptVar8->field_0x8 & 0x1f) - 0xb) < 2) {
        if ((u.utrap == 0) || (u.utraptype != 1)) {
          u.utrap = 1;
          u.utraptype = 1;
          pcVar7 = locomotion(youmonst.data,"go");
          pcVar9 = "You %s down into the pit.";
LAB_0016f26a:
          pline(pcVar9,pcVar7);
          return 0;
        }
        if ((((uwep != (obj *)0x0 && flags.autodig != '\0') && flags.nopick == '\0') &&
            ((byte)(uwep->oclass | 4U) == 6)) && (objects[uwep->otyp].oc_subtyp == '\x04')) {
LAB_0016f538:
          iVar14 = use_pick_axe2(uwep,'\0','\0','\x01');
          return iVar14;
        }
        pcVar7 = "You are already in the pit.";
        goto LAB_0016f55b;
      }
      pcVar7 = locomotion(youmonst.data,"jump");
      pcVar9 = "through the trap door";
      if ((ptVar8->field_0x8 & 0x1f) == 0xd) {
        pcVar9 = "down the hole";
      }
      pline("You %s %s.",pcVar7,pcVar9);
      bVar4 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
      if (bVar4 != '\0') {
        goto_hell('\0','\x01');
        return 1;
      }
    }
    at_ladder = level->locations[u.ux][u.uy].typ == '\x1b';
    next_level(ptVar8 == (trap *)0x0);
    at_ladder = '\0';
  }
  else {
    if ((u._1052_1_ & 1) == 0) {
      pcVar7 = "being held";
    }
    else {
      pcVar7 = "swallowed";
      if (((u.ustuck)->data->mflags1 & 0x40000) == 0) {
        pcVar7 = "engulfed";
      }
    }
    pline("You are %s, and cannot go down.",pcVar7);
  }
  return 1;
}

Assistant:

int dodown(void)
{
	struct trap *trap = 0;
	boolean stairs_down = ((u.ux == level->dnstair.sx && u.uy == level->dnstair.sy) ||
		(u.ux == level->sstairs.sx && u.uy == level->sstairs.sy && !level->sstairs.up)),
		ladder_down = (u.ux == level->dnladder.sx && u.uy == level->dnladder.sy);

	if (u.usteed && !u.usteed->mcanmove) {
		pline("%s won't move!", Monnam(u.usteed));
		return 0;
	} else if (u.usteed && u.usteed->meating) {
		pline("%s is still eating.", Monnam(u.usteed));
		return 0;
	} else if (Levitation) {
	    if ((HLevitation & I_SPECIAL) || (ELevitation & W_ARTI)) {
		/* end controlled levitation */
		if (ELevitation & W_ARTI) {
		    struct obj *obj;

		    for (obj = invent; obj; obj = obj->nobj) {
			if (obj->oartifact &&
					artifact_has_invprop(obj,LEVITATION)) {
			    if (obj->age < moves)
				obj->age = moves + rnz(100);
			    else
				obj->age += rnz(100);
			}
		    }
		}
		if (float_down(I_SPECIAL|TIMEOUT, W_ARTI))
		    return 1;   /* came down, so moved */
	    }
	    floating_above(stairs_down ? "stairs" : ladder_down ?
			   "ladder" : surface(u.ux, u.uy));
	    return 0;   /* didn't move */
	}
	if (!stairs_down && !ladder_down) {
		boolean can_fall;
		trap = t_at(level, u.ux, u.uy);
		can_fall = trap && (trap->ttyp == TRAPDOOR || trap->ttyp == HOLE);
		if (!trap ||
			(trap->ttyp != TRAPDOOR && trap->ttyp != HOLE &&
			 trap->ttyp != PIT && trap->ttyp != SPIKED_PIT)
			|| (!can_fall_thru(level) && can_fall) || !trap->tseen) {

			if (flags.autodig && !flags.nopick &&
				uwep && is_pick(uwep)) {
				return use_pick_axe2(uwep, 0, 0, 1);
			} else {
				pline("You can't go down here.");
				return 0;
			}
		}
	}
	if (u.ustuck) {
		pline("You are %s, and cannot go down.",
			!u.uswallow ? "being held" : is_animal(u.ustuck->data) ?
			"swallowed" : "engulfed");
		return 1;
	}
	if (on_level(&valley_level, &u.uz) && !u.uevent.gehennom_entered) {
		pline("You are standing at the gate to Gehennom.");
		pline("Unspeakable cruelty and harm lurk down there.");
		if (yn("Are you sure you want to enter?") != 'y')
			return 0;
		else pline("So be it.");
		u.uevent.gehennom_entered = 1;	/* don't ask again */
	}

	if (!next_to_u()) {
		pline("You are held back by your pet!");
		return 0;
	}

	if (trap) {
		if (trap->ttyp == PIT || trap->ttyp == SPIKED_PIT) {
			if (u.utrap && (u.utraptype == TT_PIT)) {
				if (flags.autodig && !flags.nopick &&
					uwep && is_pick(uwep)) {
				    return use_pick_axe2(uwep, 0, 0, 1);
				} else {
				    /* YAFM needed */
				    pline("You are already in the pit.");
				}
			} else {
				u.utrap = 1;
				u.utraptype = TT_PIT;
				pline("You %s down into the pit.",
					locomotion(youmonst.data, "go"));
			}
			return 0;
		} else {
			pline("You %s %s.", locomotion(youmonst.data, "jump"),
				trap->ttyp == HOLE ? "down the hole" :
				                     "through the trap door");
		}
	}

	if (trap && Is_stronghold(&u.uz)) {
		goto_hell(FALSE, TRUE);
	} else {
		at_ladder = (boolean) (level->locations[u.ux][u.uy].typ == LADDER);
		next_level(!trap);
		at_ladder = FALSE;
	}
	return 1;
}